

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_string.c
# Opt level: O0

void assert_not_parse_string(char *string)

{
  cJSON_bool cVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  char *string_local;
  parse_buffer buffer;
  
  buffer.hooks.reallocate = *(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28);
  memset(&string_local,0,0x38);
  string_local = string;
  sVar2 = strlen(string);
  buffer.content = (uchar *)(sVar2 + 1);
  buffer.depth = (size_t)global_hooks.allocate;
  buffer.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
  buffer.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
  cVar1 = parse_string(item,(parse_buffer *)&string_local);
  if (cVar1 != 0) {
    UnityFail("Malformed string should not be accepted.",0x43);
  }
  UnityAssertBits(0xff,0,(long)item[0].type,"Item doesn\'t have expected type.",0x44);
  if (item[0].next != (cJSON *)0x0) {
    UnityFail("Linked list next pointer is not NULL.",0x44);
  }
  if (item[0].prev != (cJSON *)0x0) {
    UnityFail("Linked list previous pointer is not NULL.",0x44);
  }
  if (item[0].child != (cJSON *)0x0) {
    UnityFail("Item has a child.",0x44);
  }
  if (item[0].string != (char *)0x0) {
    UnityFail("String is not NULL.",0x44);
  }
  if (item[0].valuestring != (char *)0x0) {
    UnityFail("Valuestring is not NULL.",0x44);
  }
  if (*(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28) != buffer.hooks.reallocate) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void assert_not_parse_string(const char * const string)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.content = (const unsigned char*)string;
    buffer.length = strlen(string) + sizeof("");
    buffer.hooks = global_hooks;

    TEST_ASSERT_FALSE_MESSAGE(parse_string(item, &buffer), "Malformed string should not be accepted.");
    assert_is_invalid(item);
}